

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
          (GeneratedCodeInfo_Annotation *this,Arena *arena,bool is_message_owned)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MessageLite_004d46b0;
  internal::InternalMetadata::InternalMetadata
            (&(this->super_Message).super_MessageLite._internal_metadata_,arena,is_message_owned);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__GeneratedCodeInfo_Annotation_004d5e28;
  this->_has_bits_ = (uint32_t  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->path_).current_size_ = 0;
  (this->path_).total_size_ = 0;
  (this->path_).arena_or_elements_ = arena;
  (this->source_file_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  this->begin_ = 0;
  this->end_ = 0;
  return;
}

Assistant:

GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena, is_message_owned),
  path_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:google.protobuf.GeneratedCodeInfo.Annotation)
}